

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O1

void __thiscall Robot::calcWorldVelocity(Robot *this)

{
  pointer pdVar1;
  pointer pdVar2;
  double dVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  vector<double,_std::allocator<double>_> ans;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b;
  vector<double,_std::allocator<double>_> local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  bMatrix(&local_28,(this->robotInfo).theta);
  pdVar1 = (this->robotInfo).selfCorVelocity.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = 0.0;
    pdVar2 = local_28.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar4].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar3 = 0.0;
    lVar5 = 0;
    do {
      dVar3 = dVar3 + pdVar2[lVar5] * pdVar1[lVar5];
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = dVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->robotInfo).robotVelocity,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Robot::calcWorldVelocity() {
    std::vector<double> ans(3);
    std::vector<std::vector<double> > b = bMatrix(this->robotInfo.theta);
    for (int i = 0; i < 3; i++) {
        ans[i] = 0;
        for (int j = 0; j < 3; j++) {
            ans[i] += b[i][j] * this->robotInfo.selfCorVelocity[j];
        }
    }
    this->robotInfo.robotVelocity = ans;
}